

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O1

void __thiscall
unodb::test::
tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
do_remove(tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          *this,key_type k,bool bypass_verifier)

{
  size_t sVar1;
  internal iVar2;
  try_update_result_type tVar3;
  size_type i;
  long lVar4;
  undefined7 in_register_00000011;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var5;
  char *pcVar6;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  pVar7;
  __int_type_conflict key_prefix_splits_before;
  key_type local_f8;
  non_atomic_array<const_std::array<std::atomic<unsigned_long>,_5UL>_> node_counts_before;
  non_atomic_array<const_std::array<std::atomic<unsigned_long>,_4UL>_> shrinking_inodes_before;
  __int_type_conflict mem_use_before;
  Message local_a0;
  non_atomic_array<const_std::array<std::atomic<unsigned_long>,_4UL>_> growing_inodes_before;
  __atomic_base<unsigned_long> local_78;
  __int_type_conflict mem_use_after;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  size_type remove_result;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  __int_type_conflict leaf_count_after;
  
  if ((int)CONCAT71(in_register_00000011,bypass_verifier) == 0) {
    local_f8 = k;
    pVar7 = std::
            _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_unodb::test::tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
            ::equal_range(&(this->values)._M_t,&local_f8);
    sVar1 = (this->values)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_unodb::test::tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ::_M_erase_aux(&(this->values)._M_t,(_Base_ptr)pVar7.first._M_node,
                   (_Base_ptr)pVar7.second._M_node);
    local_60._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (sVar1 - (this->values)._M_t._M_impl.super__Rb_tree_header._M_node_count);
    local_a0.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)&local_f8,"(remove_result)","(1)",(unsigned_long *)&local_60,
               (int *)&local_a0);
    iVar2 = local_f8._0_1_;
    if (local_f8._0_1_ == (internal)0x0) {
      testing::Message::Message(&local_a0);
      if (node_counts_before._M_elems[0] == 0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)node_counts_before._M_elems[0];
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)(node_counts_before._M_elems + 4),kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                 ,0x121,pcVar6);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)(node_counts_before._M_elems + 4),&local_a0);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)(node_counts_before._M_elems + 4));
      if ((long *)CONCAT44(local_a0.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           local_a0.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_a0.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       local_a0.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._0_4_) + 8))();
      }
    }
    if (node_counts_before._M_elems[0] != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&node_counts_before,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   node_counts_before._M_elems[0]);
    }
    if (iVar2 == (internal)0x0) {
      return;
    }
  }
  lVar4 = 0;
  do {
    node_counts_before._M_elems[lVar4 + -1] =
         (this->test_db).node_counts._M_elems[lVar4].super___atomic_base<unsigned_long>._M_i;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  shrinking_inodes_before._M_elems[3] =
       (this->test_db).current_memory_use.super___atomic_base<unsigned_long>._M_i;
  local_a0.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0;
  testing::internal::CmpHelperGT<unsigned_long,int>
            ((internal *)&local_60,"(node_counts_before[as_i<unodb::node_type::LEAF>])","(0)",
             &local_f8,(int *)&local_a0);
  if (local_60._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message(&local_a0);
    if (remove_result == 0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)remove_result;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(node_counts_before._M_elems + 4),kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
               ,0x127,pcVar6);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(node_counts_before._M_elems + 4),&local_a0);
LAB_001985cb:
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)(node_counts_before._M_elems + 4));
    _Var5._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CONCAT44(local_a0.ss_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_4_,
                  local_a0.ss_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._0_4_);
  }
  else {
    if (remove_result != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&remove_result,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   remove_result);
    }
    local_a0.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = 0;
    testing::internal::CmpHelperGT<unsigned_long,int>
              ((internal *)&local_60,"(mem_use_before)","(0)",shrinking_inodes_before._M_elems + 3,
               (int *)&local_a0);
    if (local_60._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message(&local_a0);
      if (remove_result == 0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)remove_result;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)(node_counts_before._M_elems + 4),kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                 ,0x128,pcVar6);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)(node_counts_before._M_elems + 4),&local_a0);
      goto LAB_001985cb;
    }
    if (remove_result != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&remove_result,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   remove_result);
    }
    lVar4 = 0;
    do {
      growing_inodes_before._M_elems[lVar4 + -1] =
           (this->test_db).growing_inode_counts._M_elems[lVar4].super___atomic_base<unsigned_long>.
           _M_i;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    lVar4 = 0;
    do {
      node_counts_before._M_elems[lVar4 + 4] =
           (this->test_db).shrinking_inode_counts._M_elems[lVar4].super___atomic_base<unsigned_long>
           ._M_i;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    do {
      tVar3 = olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::try_remove
                        (&this->test_db,
                         (art_key_type)
                         (k >> 0x38 | (k & 0xff000000000000) >> 0x28 | (k & 0xff0000000000) >> 0x18
                          | (k & 0xff00000000) >> 8 | (k & 0xff000000) << 8 | (k & 0xff0000) << 0x18
                          | (k & 0xff00) << 0x28 | k << 0x38));
    } while (((ushort)tVar3.super__Optional_base<bool,_true,_true>._M_payload.
                      super__Optional_payload_base<bool> >> 8 & 1) == 0);
    if (((ushort)tVar3.super__Optional_base<bool,_true,_true>._M_payload.
                 super__Optional_payload_base<bool> & 1) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"test_db.remove failed for ",0x1a);
      unodb::detail::dump_key<unsigned_long>((ostream *)&std::cerr,k);
      growing_inodes_before._M_elems[3] = CONCAT71(growing_inodes_before._M_elems[3]._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(char *)(growing_inodes_before._M_elems + 3),1);
      olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::dump
                (&this->test_db,(ostream *)&std::cerr);
      testing::Message::Message((Message *)&local_60);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_78,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                 ,0x135,"Failed");
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
      if (local_60._M_head_impl ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        return;
      }
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
      return;
    }
    if (this->parallel_test != false) {
      return;
    }
    local_78._M_i = (this->test_db).current_memory_use.super___atomic_base<unsigned_long>._M_i;
    testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
              ((internal *)&local_60,"(mem_use_after)","(mem_use_before)",&local_78._M_i,
               shrinking_inodes_before._M_elems + 3);
    if (local_60._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_38);
      if (remove_result == 0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)remove_result;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)(growing_inodes_before._M_elems + 3),kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                 ,0x14c,pcVar6);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)(growing_inodes_before._M_elems + 3),(Message *)&local_38);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)(growing_inodes_before._M_elems + 3));
      _Var5._M_head_impl = local_38._M_head_impl;
    }
    else {
      if (remove_result != 0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&remove_result,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     remove_result);
      }
      local_38._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (this->test_db).node_counts._M_elems[0].super___atomic_base<unsigned_long>._M_i;
      growing_inodes_before._M_elems[3] = local_f8 - 1;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&local_60,"(leaf_count_after)",
                 "(node_counts_before[as_i<unodb::node_type::LEAF>] - 1)",(unsigned_long *)&local_38
                 ,growing_inodes_before._M_elems + 3);
      if (local_60._M_head_impl._0_1_ != (internal)0x0) goto LAB_001985e9;
      testing::Message::Message((Message *)(growing_inodes_before._M_elems + 3));
      if (remove_result == 0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)remove_result;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&mem_use_before,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                 ,0x151,pcVar6);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&mem_use_before,(Message *)(growing_inodes_before._M_elems + 3));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mem_use_before);
      _Var5._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           growing_inodes_before._M_elems[3];
    }
  }
  if (_Var5._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)_Var5._M_head_impl + 8))();
  }
LAB_001985e9:
  if (remove_result != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&remove_result,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)remove_result)
    ;
  }
  return;
}

Assistant:

void do_remove(key_type k, bool bypass_verifier) {
    if (!bypass_verifier) {
      const auto remove_result = values.erase(to_ikey(k));
      UNODB_ASSERT_EQ(remove_result, 1);
    }

#ifdef UNODB_DETAIL_WITH_STATS
    const auto node_counts_before = test_db.get_node_counts();
    const auto mem_use_before = test_db.get_current_memory_use();
    UNODB_ASSERT_GT(node_counts_before[as_i<unodb::node_type::LEAF>], 0);
    UNODB_ASSERT_GT(mem_use_before, 0);
    const auto growing_inodes_before = test_db.get_growing_inode_counts();
    const auto shrinking_inodes_before = test_db.get_shrinking_inode_counts();
    const auto key_prefix_splits_before = test_db.get_key_prefix_splits();
#endif  // UNODB_DETAIL_WITH_STATS

    try {
      if (!test_db.remove(k)) {
        // LCOV_EXCL_START
        std::cerr << "test_db.remove failed for ";
        unodb::detail::dump_key(std::cerr, k);
        std::cerr << '\n';
        test_db.dump(std::cerr);
        FAIL();
        // LCOV_EXCL_STOP
      }
    } catch (...) {
#ifdef UNODB_DETAIL_WITH_STATS
      if (!parallel_test) {
        UNODB_ASSERT_EQ(mem_use_before, test_db.get_current_memory_use());
        UNODB_ASSERT_THAT(test_db.get_node_counts(),
                          ::testing::ElementsAreArray(node_counts_before));
        UNODB_ASSERT_THAT(test_db.get_growing_inode_counts(),
                          ::testing::ElementsAreArray(growing_inodes_before));
        UNODB_ASSERT_THAT(test_db.get_shrinking_inode_counts(),
                          ::testing::ElementsAreArray(shrinking_inodes_before));
        UNODB_ASSERT_EQ(test_db.get_key_prefix_splits(),
                        key_prefix_splits_before);
      }
#endif  // UNODB_DETAIL_WITH_STATS
      throw;
    }

#ifdef UNODB_DETAIL_WITH_STATS
    if (!parallel_test) {
      const auto mem_use_after = test_db.get_current_memory_use();
      UNODB_ASSERT_LT(mem_use_after, mem_use_before);

      const auto leaf_count_after =
          test_db.template get_node_count<::unodb::node_type::LEAF>();
      UNODB_ASSERT_EQ(leaf_count_after,
                      node_counts_before[as_i<unodb::node_type::LEAF>] - 1);
    }
#endif  // UNODB_DETAIL_WITH_STATS
  }